

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVLD4LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint Register;
  uint Register_4;
  uint Register_3;
  uint Register_2;
  uint Register_1;
  
  switch(Insn >> 10 & 3) {
  case 0:
    uVar10 = Insn >> 2 & 4;
    uVar9 = Insn >> 5 & 7;
    iVar8 = 1;
    goto LAB_001e6b92;
  case 1:
    uVar10 = Insn >> 1 & 8;
    uVar9 = Insn >> 6 & 3;
    uVar6 = Insn & 0x20;
    break;
  case 2:
    uVar10 = Insn >> 4 & 3;
    if ((Insn >> 4 & 3) != 0) {
      if (uVar10 == 3) {
        return MCDisassembler_Fail;
      }
      uVar10 = 4 << (sbyte)uVar10;
    }
    uVar9 = Insn >> 7 & 1;
    uVar6 = Insn & 0x40;
    break;
  case 3:
    goto switchD_001e6b15_caseD_3;
  }
  iVar8 = 2 - (uint)(uVar6 == 0);
LAB_001e6b92:
  uVar6 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar1 = DPRDecoderTable[uVar6];
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  if (iVar8 + uVar6 < 0x20) {
    uVar2 = DPRDecoderTable[iVar8 + uVar6];
    MCOperand_CreateReg0(Inst,(uint)uVar2);
    uVar7 = uVar6 + iVar8 * 2;
    if (uVar7 < 0x20) {
      uVar3 = DPRDecoderTable[uVar7];
      MCOperand_CreateReg0(Inst,(uint)uVar3);
      uVar6 = iVar8 * 3 + uVar6;
      if (uVar6 < 0x20) {
        uVar7 = Insn & 0xf;
        uVar4 = DPRDecoderTable[uVar6];
        MCOperand_CreateReg0(Inst,(uint)uVar4);
        uVar5 = GPRDecoderTable[Insn >> 0x10 & 0xf];
        MCOperand_CreateReg0(Inst,(uint)uVar5);
        if (uVar7 == 0xf) {
          MCOperand_CreateImm0(Inst,(ulong)uVar10);
        }
        else {
          MCOperand_CreateReg0(Inst,(uint)uVar5);
          MCOperand_CreateImm0(Inst,(ulong)uVar10);
          if (uVar7 == 0xd) {
            uVar10 = 0;
          }
          else {
            uVar10 = (uint)GPRDecoderTable[uVar7];
          }
          MCOperand_CreateReg0(Inst,uVar10);
        }
        MCOperand_CreateReg0(Inst,(uint)uVar1);
        MCOperand_CreateReg0(Inst,(uint)uVar2);
        MCOperand_CreateReg0(Inst,(uint)uVar3);
        MCOperand_CreateReg0(Inst,(uint)uVar4);
        MCOperand_CreateImm0(Inst,(ulong)uVar9);
        return MCDisassembler_Success;
      }
      return MCDisassembler_Fail;
    }
  }
switchD_001e6b15_caseD_3:
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeVLD4LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 4;
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 8;
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			switch (fieldFromInstruction_4(Insn, 4, 2)) {
				case 0:
					align = 0; break;
				case 3:
					return MCDisassembler_Fail;
				default:
					align = 4 << fieldFromInstruction_4(Insn, 4, 2); break;
			}

			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+3*inc, Address, Decoder)))
		return MCDisassembler_Fail;

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+3*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}